

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

void * Abc_NodeGetCuts(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int *piVar4;
  int *piVar5;
  void **ppvVar6;
  int iVar7;
  Cut_Params_t *pCVar8;
  Vec_Int_t *pVVar9;
  Cut_Cut_t *pCVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  if ((pObj->vFanins).nSize != 2) {
    __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCut.c"
                  ,0x1b6,"void *Abc_NodeGetCuts(void *, Abc_Obj_t *, int, int)");
  }
  if ((pObj->vFanouts).nSize < 2) {
    bVar13 = false;
  }
  else {
    iVar7 = Abc_NodeIsMuxControlType(pObj);
    bVar13 = iVar7 == 0;
  }
  if (bVar13 != false) {
    Cut_ManIncrementDagNodes((Cut_Man_t *)p);
  }
  if (fTree == 0) {
    uVar12 = 0;
  }
  else {
    pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    uVar12 = 0;
    uVar11 = 0;
    if (1 < (pAVar3->vFanouts).nSize) {
      iVar7 = Abc_NodeIsMuxControlType(pAVar3);
      uVar11 = (uint)(iVar7 == 0);
    }
    pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
    if (1 < (pAVar3->vFanouts).nSize) {
      iVar7 = Abc_NodeIsMuxControlType(pAVar3);
      uVar12 = (uint)(iVar7 == 0) * 2;
    }
    uVar12 = uVar12 | uVar11;
  }
  pCVar8 = Cut_ManReadParams((Cut_Man_t *)p);
  if (pCVar8->fLocal != 0) {
    pVVar9 = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
    iVar7 = pObj->Id;
    if ((-1 < (long)iVar7) && (iVar7 < pVVar9->nSize)) {
      if (pVVar9->pArray[iVar7] != 0) {
        Cut_ManIncrementDagNodes((Cut_Man_t *)p);
      }
      iVar7 = pObj->Id;
      if ((-1 < (long)iVar7) && (iVar1 = pVVar9->nSize, iVar7 < iVar1)) {
        piVar4 = pVVar9->pArray;
        bVar13 = piVar4[iVar7] == 0;
        piVar5 = (pObj->vFanins).pArray;
        ppvVar6 = pObj->pNtk->vObjs->pArray;
        iVar7 = *(int *)((long)ppvVar6[*piVar5] + 0x10);
        if ((-1 < (long)iVar7) && (iVar7 < iVar1)) {
          iVar2 = *(int *)((long)ppvVar6[piVar5[1]] + 0x10);
          if ((-1 < (long)iVar2) && (iVar2 < iVar1)) {
            uVar12 = piVar4[iVar2] * 2 | piVar4[iVar7];
            goto LAB_0024472d;
          }
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  bVar13 = (bool)(fDag == 0 | bVar13);
LAB_0024472d:
  piVar4 = (pObj->vFanins).pArray;
  pCVar10 = Cut_NodeComputeCuts((Cut_Man_t *)p,pObj->Id,*piVar4,piVar4[1],
                                *(uint *)&pObj->field_0x14 >> 10 & 1,
                                *(uint *)&pObj->field_0x14 >> 0xb & 1,(uint)bVar13,uVar12);
  return pCVar10;
}

Assistant:

void * Abc_NodeGetCuts( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    Abc_Obj_t * pFanin;
    int fDagNode, fTriv, TreeCode = 0;
//    assert( Abc_NtkIsStrash(pObj->pNtk) );
    assert( Abc_ObjFaninNum(pObj) == 2 );

    // check if the node is a DAG node
    fDagNode = (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj));
    // increment the counter of DAG nodes
    if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
    // add the trivial cut if the node is a DAG node, or if we compute all cuts
    fTriv = fDagNode || !fDag;
    // check if fanins are DAG nodes
    if ( fTree )
    {
        pFanin = Abc_ObjFanin0(pObj);
        TreeCode |=  (Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin));
        pFanin = Abc_ObjFanin1(pObj);
        TreeCode |= ((Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin)) << 1);
    }

    // changes due to the global/local cut computation
    {
        Cut_Params_t * pParams = Cut_ManReadParams((Cut_Man_t *)p);
        if ( pParams->fLocal )
        {
            Vec_Int_t * vNodeAttrs = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
            fDagNode = Vec_IntEntry( vNodeAttrs, pObj->Id );
            if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
//            fTriv = fDagNode || !pParams->fGlobal;
            fTriv = !Vec_IntEntry( vNodeAttrs, pObj->Id );
            TreeCode = 0;
            pFanin = Abc_ObjFanin0(pObj);
            TreeCode |=  Vec_IntEntry( vNodeAttrs, pFanin->Id );
            pFanin = Abc_ObjFanin1(pObj);
            TreeCode |= (Vec_IntEntry( vNodeAttrs, pFanin->Id ) << 1);
        }
    }
    return Cut_NodeComputeCuts( (Cut_Man_t *)p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
        Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj), fTriv, TreeCode );  
}